

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O1

void __thiscall despot::RegDemo::Init(RegDemo *this,istream *is)

{
  int *piVar1;
  double *pdVar2;
  uint uVar3;
  pointer pdVar4;
  pointer pvVar5;
  long lVar6;
  vector<despot::State,_std::allocator<despot::State>_> *this_00;
  int iVar7;
  int iVar8;
  istream *piVar9;
  State *pSVar10;
  int iVar11;
  int a;
  long lVar12;
  RegDemo *pRVar13;
  long lVar14;
  ulong uVar15;
  string tok;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  *local_80;
  long local_78;
  RegDemo *local_70;
  vector<double,_std::allocator<double>_> *local_68;
  int local_60;
  int local_5c;
  ulong local_58;
  State local_50 [32];
  
  local_a0 = &local_90;
  local_98 = 0;
  local_90 = 0;
  piVar9 = std::operator>>(is,(string *)&local_a0);
  piVar9 = std::operator>>(piVar9,(string *)&local_a0);
  piVar1 = &this->size_;
  std::istream::operator>>((istream *)piVar9,piVar1);
  std::vector<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>::resize
            (&this->states_,(long)this->size_ + 1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->obs_,(long)this->size_ + 1);
  local_68 = &this->trap_prob_;
  std::vector<double,_std::allocator<double>_>::resize(local_68,(long)this->size_ + 1);
  iVar7 = *piVar1;
  local_70 = this;
  if (0 < iVar7) {
    uVar15 = 0;
    do {
      pSVar10 = (State *)operator_new(0x20);
      despot::State::State(pSVar10);
      *(undefined ***)pSVar10 = &PTR__State_0010daa8;
      *(int *)(pSVar10 + 0xc) = (int)uVar15;
      (this->states_).
      super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar15] = (RegDemoState *)pSVar10;
      (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar15] = (ulong)(uVar15 == 2);
      std::istream::_M_extract<double>((double *)is);
      if (uVar15 == *piVar1 - 1) {
        pdVar4 = (local_70->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_70->goal_reward_ = pdVar4[uVar15];
        pdVar4[uVar15] = 0.0;
      }
      uVar15 = uVar15 + 1;
      iVar7 = *piVar1;
    } while ((long)uVar15 < (long)iVar7);
  }
  pSVar10 = (State *)operator_new(0x20);
  despot::State::State(pSVar10);
  pRVar13 = local_70;
  *(undefined ***)pSVar10 = &PTR__State_0010daa8;
  *(int *)(pSVar10 + 0xc) = iVar7;
  iVar7 = local_70->size_;
  (local_70->states_).
  super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>._M_impl.
  super__Vector_impl_data._M_start[iVar7] = (RegDemoState *)pSVar10;
  (local_70->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[iVar7] = 2;
  (local_70->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iVar7] = 1.0;
  local_80 = &local_70->transition_probabilities_;
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::resize(local_80,(long)(local_70->states_).
                          super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_70->states_).
                          super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
  if ((pRVar13->states_).
      super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pRVar13->states_).
      super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar15 = 0;
    do {
      pvVar5 = (pRVar13->transition_probabilities_).
               super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar7 = (**(code **)(*(long *)pRVar13 + 0x28))();
      local_78 = uVar15 * 3;
      std::
      vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
      ::resize(pvVar5 + uVar15,(long)iVar7);
      local_58 = uVar15 + 1;
      iVar7 = (int)uVar15;
      local_60 = iVar7 + 1;
      local_5c = iVar7 + -1;
      lVar14 = 0;
      for (lVar12 = 0; iVar8 = (**(code **)(*(long *)local_70 + 0x28))(), lVar12 < iVar8;
          lVar12 = lVar12 + 1) {
        uVar3 = *piVar1;
        if (uVar15 == uVar3) {
          lVar6 = *(long *)((long)&(((local_80->
                                     super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                   )._M_impl.super__Vector_impl_data + local_78 * 8);
          despot::State::State(local_50,iVar7,1.0);
          std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                    ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + lVar14),
                     local_50);
LAB_00106dc0:
          despot::State::~State(local_50);
        }
        else {
          iVar8 = local_60;
          if (((int)lVar12 == 2) || (iVar8 = iVar7, (int)lVar12 != 0)) {
            if (lVar12 == 1) {
              iVar8 = local_5c;
            }
            if (iVar8 < 1) {
              iVar8 = 0;
            }
            iVar11 = uVar3 - 1;
            if (iVar8 < (int)uVar3) {
              iVar11 = iVar8;
            }
            pdVar4 = (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar2 = pdVar4 + iVar11;
            if (*pdVar2 <= 1.0 && *pdVar2 != 1.0) {
              lVar6 = *(long *)((long)&(((local_80->
                                         super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                       )._M_impl.super__Vector_impl_data + local_78 * 8);
              despot::State::State(local_50,iVar11,1.0 - pdVar4[iVar11]);
              std::vector<despot::State,_std::allocator<despot::State>_>::
              emplace_back<despot::State>
                        ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + lVar14),
                         local_50);
              despot::State::~State(local_50);
            }
            pdVar4 = (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if (0.0 < pdVar4[iVar11]) {
              lVar6 = *(long *)((long)&(((local_80->
                                         super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                       )._M_impl.super__Vector_impl_data + local_78 * 8);
              despot::State::State(local_50,*piVar1,pdVar4[iVar11]);
              std::vector<despot::State,_std::allocator<despot::State>_>::
              emplace_back<despot::State>
                        ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + lVar14),
                         local_50);
              goto LAB_00106dc0;
            }
          }
          else if (uVar15 != uVar3 - 1) {
            this_00 = *(vector<despot::State,_std::allocator<despot::State>_> **)
                       ((long)&(((local_80->
                                 super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                               )._M_impl.super__Vector_impl_data + local_78 * 8);
            despot::State::State(local_50,iVar7,1.0);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      (this_00,local_50);
            goto LAB_00106dc0;
          }
        }
        lVar14 = lVar14 + 0x18;
      }
      uVar15 = local_58;
      pRVar13 = local_70;
    } while (local_58 <
             (ulong)((long)(local_70->states_).
                           super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_70->states_).
                           super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  return;
}

Assistant:

void RegDemo::Init(istream& is) {
	string tok;
	is >> tok >> tok >> size_;
	states_.resize(size_ + 1);
	obs_.resize(size_ + 1);
	trap_prob_.resize(size_ + 1);
	for (int x = 0; x < size_; x++) {
		states_[x] = new RegDemoState(x);
		obs_[x] = (x == 2 ? 1 : 0);

		is >> trap_prob_[x];

		if (x == size_ - 1) {
			goal_reward_ = trap_prob_[x];
			trap_prob_[x] = 0;
		}
	}
	states_[size_] = new RegDemoState(size_); // Trapped
	obs_[size_] = 2;
	trap_prob_[size_] = 1.0; // No way to escape

	// Build transition matrix
	transition_probabilities_.resize(states_.size());
	for (int s = 0; s < states_.size(); s++) {
		transition_probabilities_[s].resize(NumActions());

		for (int a = 0; a < NumActions(); a++) {
			if (s == size_) {
				transition_probabilities_[s][a].push_back(State(s, 1.0));
			} else if (a == A_STAY) {
				if (s != size_ - 1) // Not a terminal state
					transition_probabilities_[s][a].push_back(State(s, 1.0));
			} else {
				int next = s;
				if (a == A_RIGHT)
					next = s + 1;
				if (a == A_LEFT)
					next = s - 1;

				if (next < 0)
					next = 0;
				if (next >= size_)
					next = size_ - 1;

				if (trap_prob_[next] < 1.0)
					transition_probabilities_[s][a].push_back(
						State(next, 1 - trap_prob_[next]));
				if (trap_prob_[next] > 0.0)
					transition_probabilities_[s][a].push_back(
						State(size_, trap_prob_[next]));
			}
		}
	}
}